

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinePropertyCommand.cxx
# Opt level: O0

bool __thiscall
cmDefinePropertyCommand::InitialPass
          (cmDefinePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  const_reference pvVar2;
  ostream *poVar3;
  size_type sVar4;
  ulong uVar5;
  cmState *this_00;
  char *ShortDescription;
  char *FullDescription;
  allocator local_419;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream e_1;
  uint local_20c;
  int local_208;
  uint i;
  Doing doing;
  bool inherited;
  ostringstream local_1e0 [8];
  ostringstream e;
  string *scope_arg;
  ScopeType scope;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmDefinePropertyCommand *this_local;
  
  local_28 = param_2;
  param_3_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_3_local,0);
    bVar1 = std::operator==(pvVar2,"GLOBAL");
    if (bVar1) {
      scope_arg._0_4_ = GLOBAL;
    }
    else {
      bVar1 = std::operator==(pvVar2,"DIRECTORY");
      if (bVar1) {
        scope_arg._0_4_ = DIRECTORY;
      }
      else {
        bVar1 = std::operator==(pvVar2,"TARGET");
        if (bVar1) {
          scope_arg._0_4_ = TARGET;
        }
        else {
          bVar1 = std::operator==(pvVar2,"SOURCE");
          if (bVar1) {
            scope_arg._0_4_ = SOURCE_FILE;
          }
          else {
            bVar1 = std::operator==(pvVar2,"TEST");
            if (bVar1) {
              scope_arg._0_4_ = TEST;
            }
            else {
              bVar1 = std::operator==(pvVar2,"VARIABLE");
              if (bVar1) {
                scope_arg._0_4_ = VARIABLE;
              }
              else {
                bVar1 = std::operator==(pvVar2,"CACHED_VARIABLE");
                if (!bVar1) {
                  std::__cxx11::ostringstream::ostringstream(local_1e0);
                  poVar3 = std::operator<<((ostream *)local_1e0,"given invalid scope ");
                  poVar3 = std::operator<<(poVar3,(string *)pvVar2);
                  poVar3 = std::operator<<(poVar3,".  ");
                  poVar3 = std::operator<<(poVar3,"Valid scopes are ");
                  poVar3 = std::operator<<(poVar3,"GLOBAL, DIRECTORY, TARGET, SOURCE, ");
                  std::operator<<(poVar3,"TEST, VARIABLE, CACHED_VARIABLE.");
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,(string *)&doing);
                  std::__cxx11::string::~string((string *)&doing);
                  this_local._7_1_ = 0;
                  std::__cxx11::ostringstream::~ostringstream(local_1e0);
                  goto LAB_006467f0;
                }
                scope_arg._0_4_ = CACHED_VARIABLE;
              }
            }
          }
        }
      }
    }
    i._3_1_ = false;
    local_208 = 0;
    for (local_20c = 1;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_3_local), local_20c < sVar4; local_20c = local_20c + 1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_3_local,(ulong)local_20c);
      bVar1 = std::operator==(pvVar2,"PROPERTY");
      if (bVar1) {
        local_208 = 1;
      }
      else {
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,(ulong)local_20c);
        bVar1 = std::operator==(pvVar2,"BRIEF_DOCS");
        if (bVar1) {
          local_208 = 2;
        }
        else {
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_3_local,(ulong)local_20c);
          bVar1 = std::operator==(pvVar2,"FULL_DOCS");
          if (bVar1) {
            local_208 = 3;
          }
          else {
            pvVar2 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_3_local,(ulong)local_20c);
            bVar1 = std::operator==(pvVar2,"INHERITED");
            if (bVar1) {
              local_208 = 0;
              i._3_1_ = true;
            }
            else if (local_208 == 1) {
              local_208 = 0;
              pvVar2 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_3_local,(ulong)local_20c);
              std::__cxx11::string::operator=((string *)&this->PropertyName,(string *)pvVar2);
            }
            else if (local_208 == 2) {
              pvVar2 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_3_local,(ulong)local_20c);
              std::__cxx11::string::operator+=((string *)&this->BriefDocs,(string *)pvVar2);
            }
            else {
              if (local_208 != 3) {
                std::__cxx11::ostringstream::ostringstream(local_388);
                poVar3 = std::operator<<((ostream *)local_388,"given invalid argument \"");
                pvVar2 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_3_local,(ulong)local_20c);
                poVar3 = std::operator<<(poVar3,(string *)pvVar2);
                std::operator<<(poVar3,"\".");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,&local_3a8);
                std::__cxx11::string::~string((string *)&local_3a8);
                this_local._7_1_ = 0;
                std::__cxx11::ostringstream::~ostringstream(local_388);
                goto LAB_006467f0;
              }
              pvVar2 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_3_local,(ulong)local_20c);
              std::__cxx11::string::operator+=((string *)&this->FullDocs,(string *)pvVar2);
            }
          }
        }
      }
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          ShortDescription = (char *)std::__cxx11::string::c_str();
          FullDescription = (char *)std::__cxx11::string::c_str();
          cmState::DefineProperty
                    (this_00,&this->PropertyName,(ScopeType)scope_arg,ShortDescription,
                     FullDescription,i._3_1_);
          this_local._7_1_ = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_418,"not given a FULL_DOCS <full-doc> argument.",&local_419);
          cmCommand::SetError(&this->super_cmCommand,&local_418);
          std::__cxx11::string::~string((string *)&local_418);
          std::allocator<char>::~allocator((allocator<char> *)&local_419);
          this_local._7_1_ = 0;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_3f0,"not given a BRIEF_DOCS <brief-doc> argument.",&local_3f1);
        cmCommand::SetError(&this->super_cmCommand,&local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        this_local._7_1_ = 0;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3c8,"not given a PROPERTY <name> argument.",&local_3c9);
      cmCommand::SetError(&this->super_cmCommand,&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
      this_local._7_1_ = 0;
    }
  }
LAB_006467f0:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmDefinePropertyCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // Get the scope in which to define the property.
  cmProperty::ScopeType scope;
  std::string const& scope_arg = args[0];

  if (scope_arg == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (scope_arg == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (scope_arg == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (scope_arg == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (scope_arg == "TEST") {
    scope = cmProperty::TEST;
  } else if (scope_arg == "VARIABLE") {
    scope = cmProperty::VARIABLE;
  } else if (scope_arg == "CACHED_VARIABLE") {
    scope = cmProperty::CACHED_VARIABLE;
  } else {
    std::ostringstream e;
    e << "given invalid scope " << scope_arg << ".  "
      << "Valid scopes are "
      << "GLOBAL, DIRECTORY, TARGET, SOURCE, "
      << "TEST, VARIABLE, CACHED_VARIABLE.";
    this->SetError(e.str());
    return false;
  }

  // Parse remaining arguments.
  bool inherited = false;
  enum Doing
  {
    DoingNone,
    DoingProperty,
    DoingBrief,
    DoingFull
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "PROPERTY") {
      doing = DoingProperty;
    } else if (args[i] == "BRIEF_DOCS") {
      doing = DoingBrief;
    } else if (args[i] == "FULL_DOCS") {
      doing = DoingFull;
    } else if (args[i] == "INHERITED") {
      doing = DoingNone;
      inherited = true;
    } else if (doing == DoingProperty) {
      doing = DoingNone;
      this->PropertyName = args[i];
    } else if (doing == DoingBrief) {
      this->BriefDocs += args[i];
    } else if (doing == DoingFull) {
      this->FullDocs += args[i];
    } else {
      std::ostringstream e;
      e << "given invalid argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
    }
  }

  // Make sure a property name was found.
  if (this->PropertyName.empty()) {
    this->SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  // Make sure documentation was given.
  if (this->BriefDocs.empty()) {
    this->SetError("not given a BRIEF_DOCS <brief-doc> argument.");
    return false;
  }
  if (this->FullDocs.empty()) {
    this->SetError("not given a FULL_DOCS <full-doc> argument.");
    return false;
  }

  // Actually define the property.
  this->Makefile->GetState()->DefineProperty(
    this->PropertyName, scope, this->BriefDocs.c_str(), this->FullDocs.c_str(),
    inherited);

  return true;
}